

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O3

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::callHeld(TestMoreStuffImpl *this,CallHeldContext context)

{
  PromiseArena *pPVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long *plVar4;
  void *pvVar5;
  size_t in_RCX;
  PromiseArena *in_RDX;
  void *__buf;
  int in_R8D;
  undefined4 uVar6;
  TransformPromiseNodeBase *this_00;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request;
  undefined1 local_e8 [64];
  undefined4 *local_a8;
  undefined8 *local_90;
  long *local_88;
  SegmentReader *local_80;
  CapTableReader *pCStack_78;
  WirePointer *local_70;
  int iStack_68;
  undefined4 uStack_64;
  Maybe<capnp::MessageSize> local_60;
  PointerReader local_48;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  local_60.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            ((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)(local_e8 + 0x30),(Client *)(context.hook + 3),&local_60);
  *local_a8 = 0x7b;
  *(byte *)(local_a8 + 1) = *(byte *)(local_a8 + 1) | 1;
  (*(code *)**(undefined8 **)in_RDX->bytes)(&local_80);
  local_48.pointer = local_70;
  local_48.nestingLimit = iStack_68;
  local_48._28_4_ = uStack_64;
  local_48.segment = local_80;
  local_48.capTable = pCStack_78;
  uVar6 = 0;
  PointerReader::getStruct((StructReader *)local_e8,&local_48,(word *)0x0);
  if (0x1f < (uint)local_e8._32_4_) {
    uVar6 = *(undefined4 *)local_e8._16_8_;
  }
  local_a8[2] = uVar6;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
          *)local_e8,(int)local_e8 + 0x30,__buf,in_RCX,in_R8D);
  uVar2 = local_e8._0_8_;
  pPVar1 = *(PromiseArena **)&((SegmentReader *)local_e8._0_8_)->id;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_e8._0_8_ - (long)pPVar1) < 0x28) {
    pvVar5 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar5 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)local_e8,
               kj::_::
               SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++:1121:7)>
               ::anon_class_8_1_bc11688f_for_func::operator());
    *(undefined ***)((long)pvVar5 + 0x3d8) = &PTR_destroy_0036e7d0;
    *(PromiseArena **)((long)pvVar5 + 0x3f8) = in_RDX;
    *(void **)((long)pvVar5 + 0x3e0) = pvVar5;
  }
  else {
    *(PromiseArena **)&((SegmentReader *)local_e8._0_8_)->id = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)&((PromiseArenaMember *)(local_e8._0_8_ + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)local_e8,
               kj::_::
               SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++:1121:7)>
               ::anon_class_8_1_bc11688f_for_func::operator());
    ((PromiseArenaMember *)(uVar2 + -0x30))->arena = (PromiseArena *)&PTR_destroy_0036e7d0;
    ((PromiseArenaMember *)(uVar2 + -0x10))->arena = in_RDX;
    ((PromiseArenaMember *)(uVar2 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  uVar3 = local_e8._32_8_;
  uVar2 = local_e8._24_8_;
  *(TransformPromiseNodeBase **)&this->super_Server = this_00;
  if ((WirePointer *)local_e8._24_8_ != (WirePointer *)0x0) {
    local_e8._24_8_ = (WirePointer *)0x0;
    local_e8._32_4_ = 0;
    local_e8._36_2_ = 0;
    local_e8._38_2_ = 0;
    (***(_func_int ***)local_e8._40_8_)(local_e8._40_8_,uVar2,8,uVar3,uVar3,0);
  }
  uVar2 = local_e8._16_8_;
  if ((long *)local_e8._16_8_ != (long *)0x0) {
    local_e8._16_8_ = (long *)0x0;
    (***(_func_int ***)local_e8._8_8_)(local_e8._8_8_,uVar2 + *(long *)(*(long *)uVar2 + -0x10));
  }
  uVar2 = local_e8._0_8_;
  if ((SegmentBuilder *)local_e8._0_8_ != (SegmentBuilder *)0x0) {
    local_e8._0_8_ = (SegmentBuilder *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar2);
  }
  plVar4 = local_88;
  if (local_88 != (long *)0x0) {
    local_88 = (long *)0x0;
    (**(code **)*local_90)(local_90,(long)plVar4 + *(long *)(*plVar4 + -0x10));
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::callHeld(CallHeldContext context) {
  ++callCount;

  auto request = clientToHold.fooRequest();
  request.setI(123);
  request.setJ(true);
  request.setExpectedCallCount(context.getParams().getExpectedCallCount());

  return request.send().then(
      [KJ_CPCAP(context)](Response<test::TestInterface::FooResults>&& response) mutable {
        EXPECT_EQ("foo", response.getX());
        context.getResults().setS("bar");
      }